

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

RegOffsetInfo * mpp_service_next_reg_offset(MppDevMppService *p)

{
  int iVar1;
  int iVar2;
  RegOffsetInfo *pRVar3;
  RegOffsetInfo *pRVar4;
  RegOffsetInfo *orig;
  RegOffsetInfo *info;
  MppDevMppService *p_local;
  
  if (p->reg_offset_max <= p->reg_offset_count + p->reg_offset_pos) {
    pRVar4 = p->reg_offset_info;
    if ((mpp_device_debug & 0x40) != 0) {
      _mpp_log_l(4,"mpp_serivce","enlarge reg offset count %d -> %d\n",(char *)0x0,
                 (ulong)(uint)p->reg_offset_max,(ulong)(uint)(p->reg_offset_max << 1),pRVar4,0);
    }
    pRVar3 = (RegOffsetInfo *)
             mpp_osal_realloc("mpp_service_next_reg_offset",p->reg_offset_info,
                              (long)(p->reg_offset_max << 1) << 3);
    p->reg_offset_info = pRVar3;
    if (p->reg_offset_info == (RegOffsetInfo *)0x0) {
      _mpp_log_l(2,"mpp_serivce","failed to enlarge request buffer\n","mpp_service_next_reg_offset")
      ;
      return (RegOffsetInfo *)0x0;
    }
    if (pRVar4 != p->reg_offset_info) {
      _mpp_log_l(3,"mpp_serivce","enlarge reg offset buffer and get different pointer\n",
                 "mpp_service_next_reg_offset");
    }
    p->reg_offset_max = p->reg_offset_max << 1;
  }
  pRVar4 = p->reg_offset_info;
  iVar1 = p->reg_offset_count;
  iVar2 = p->reg_offset_pos;
  if ((mpp_device_debug & 0x40) != 0) {
    _mpp_log_l(4,"mpp_serivce","reg offset %d : %d\n",(char *)0x0,(ulong)(uint)p->reg_offset_pos,
               (ulong)(uint)p->reg_offset_count);
  }
  p->reg_offset_count = p->reg_offset_count + 1;
  return pRVar4 + (iVar1 + iVar2);
}

Assistant:

RegOffsetInfo *mpp_service_next_reg_offset(MppDevMppService *p)
{
    RegOffsetInfo *info = NULL;

    if (p->reg_offset_count + p->reg_offset_pos >= p->reg_offset_max) {
        RegOffsetInfo *orig = p->reg_offset_info;

        mpp_dev_dbg_msg("enlarge reg offset count %d -> %d\n",
                        p->reg_offset_max, p->reg_offset_max * 2);
        p->reg_offset_info = mpp_realloc(p->reg_offset_info, RegOffsetInfo, p->reg_offset_max * 2);
        if (NULL == p->reg_offset_info) {
            mpp_err_f("failed to enlarge request buffer\n");
            return NULL;
        }
        if (orig != p->reg_offset_info)
            mpp_logw_f("enlarge reg offset buffer and get different pointer\n");

        p->reg_offset_max *= 2;
    }

    info = &p->reg_offset_info[p->reg_offset_count + p->reg_offset_pos];
    mpp_dev_dbg_msg("reg offset %d : %d\n", p->reg_offset_pos, p->reg_offset_count);
    p->reg_offset_count++;

    return info;
}